

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
Number_NegativeExplicitBase10_Test<wchar_t>::TestBody
          (Number_NegativeExplicitBase10_Test<wchar_t> *this)

{
  bool bVar1;
  char *pcVar2;
  size_t in_RCX;
  void *__buf;
  AssertHelper local_c8;
  Message local_c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_48;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *expected;
  undefined1 local_30 [8];
  number_long v;
  longlong value;
  Number_NegativeExplicitBase10_Test<wchar_t> *this_local;
  
  v.v_ = -0x8000000000000000;
  pstore::dump::number_long::number_long((number_long *)local_30,-0x8000000000000000,10);
  pstore::dump::value::write((value *)local_30,(int)this + 0x10,__buf,in_RCX);
  std::__cxx11::to_string((string *)&gtest_ar.message_,-0x8000000000000000);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  convert<wchar_t>(&local_68,pcVar2);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_48 = &local_68;
  std::__cxx11::wostringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            ((EqHelper *)local_98,"expected","this->out_.str ()",&local_68,&local_b8);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  pstore::dump::number_long::~number_long((number_long *)local_30);
  return;
}

Assistant:

TYPED_TEST (Number, NegativeExplicitBase10) {
    const auto value = std::numeric_limits<long long>::min ();
    pstore::dump::number_long v (value, 10);
    v.write (this->out_);
    auto const & expected = convert<TypeParam> (std::to_string (value).c_str ());
    EXPECT_EQ (expected, this->out_.str ());
}